

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1657:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1657:35)>
             *this,MessageBuilder *params)

{
  uint *puVar1;
  DebugExpression<bool> _kjCondition_1;
  Reader desc;
  Reader call;
  Reader message;
  Reader capTable;
  DebugComparison<unsigned_int,_int> _kjCondition;
  String local_288;
  StructReader local_270;
  Reader local_240;
  Reader local_210;
  ListReader local_1e0;
  undefined1 local_1b0 [24];
  WirePointer *local_198;
  bool local_190;
  
  capnp::MessageBuilder::getRoot<capnp::rpc::Message>((Builder *)local_1b0,params);
  capnp::_::StructBuilder::asReader((StructBuilder *)local_1b0);
  if ((((local_210._reader.dataSize < 0x10) || (*local_210._reader.data != 2)) ||
      (capnp::rpc::Message::Reader::getCall(&local_240,&local_210),
      local_240._reader.dataSize < 0x80)) ||
     ((*(long *)((long)local_240._reader.data + 8) != -0x2238f40687becc31 ||
      (*(short *)((long)local_240._reader.data + 4) != 0)))) {
    return true;
  }
  capnp::rpc::Call::Reader::getParams((Reader *)local_1b0,&local_240);
  capnp::rpc::Payload::Reader::getCapTable((Reader *)&local_1e0,(Reader *)local_1b0);
  local_1b0._0_4_ = local_1e0.elementCount;
  local_1b0._4_4_ = 1;
  local_1b0._8_8_ = " == ";
  local_1b0._16_8_ = &DAT_00000005;
  local_198 = (WirePointer *)CONCAT71(local_198._1_7_,local_1e0.elementCount == 1);
  if (local_1e0.elementCount != 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
              ((Fault *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x682,FAILED,"capTable.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_int,_int> *)local_1b0);
    kj::_::Debug::Fault::fatal((Fault *)&local_270);
  }
  capnp::_::ListReader::getStructElement(&local_270,&local_1e0,0);
  if (local_270.dataSize < 0x10) {
    local_288.content.ptr._0_1_ = false;
  }
  else {
    local_288.content.ptr._0_1_ = *(short *)(char *)local_270.data == 2;
    if ((bool)local_288.content.ptr._0_1_) {
      local_1b0._0_4_ = 0;
      if (0x3f < local_270.dataSize) {
        local_1b0._0_4_ = *(undefined4 *)((char *)local_270.data + 4);
      }
      local_1b0._8_8_ = (this->f).expectedExportNumber;
      local_190 = local_1b0._0_4_ ==
                  *(uint32_t *)
                   &(((CapTableBuilder *)local_1b0._8_8_)->super_CapTableReader).
                    _vptr_CapTableReader;
      local_1b0._16_8_ = " == ";
      local_198 = (WirePointer *)&DAT_00000005;
      if (local_190) {
        puVar1 = (this->f).interceptCount;
        *puVar1 = *puVar1 + 1;
        if (*(this->f).shouldThrowFromSend != true) {
          return true;
        }
        kj::_::Debug::makeDescription<char_const(&)[12]>
                  (&local_288,(Debug *)0x451fdf,"intercepted",(char (*) [12])local_270.data);
        Exception::Exception
                  ((Exception *)local_1b0,FAILED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x689,&local_288);
        throwFatalException((Exception *)local_1b0,0);
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                ((Fault *)&local_288,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x685,FAILED,"desc.getSenderPromise() == expectedExportNumber","_kjCondition,",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_1b0);
      kj::_::Debug::Fault::fatal((Fault *)&local_288);
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
             ,0x684,FAILED,"desc.isSenderPromise()","_kjCondition,",
             (DebugExpression<bool> *)&local_288);
  kj::_::Debug::Fault::fatal((Fault *)local_1b0);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }